

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0041ae78 == '\x01') {
    DAT_0041ae78 = '\0';
    (*(code *)*_Pipeline_default_instance_)();
  }
  if (DAT_0041aea0 == '\x01') {
    DAT_0041aea0 = '\0';
    (*(code *)*_PipelineClassifier_default_instance_)();
  }
  if (DAT_0041aec8 == '\x01') {
    DAT_0041aec8 = '\0';
    (*(code *)*_PipelineRegressor_default_instance_)();
  }
  if (DAT_0041af00 == '\x01') {
    DAT_0041af00 = '\0';
    (*(code *)*_FeatureDescription_default_instance_)();
  }
  if (DAT_0041af98 == '\x01') {
    DAT_0041af98 = '\0';
    (*(code *)*_Metadata_default_instance_)();
  }
  if (DAT_0041b018 == '\x01') {
    DAT_0041b018 = '\0';
    (*(code *)*_ModelDescription_default_instance_)();
  }
  if (DAT_0041b048 == '\x01') {
    DAT_0041b048 = '\0';
    (*(code *)*_SerializedModel_default_instance_)();
  }
  if (DAT_0041b080 == '\x01') {
    DAT_0041b080 = 0;
    (*(code *)*_Model_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Pipeline_default_instance_.Shutdown();
  _PipelineClassifier_default_instance_.Shutdown();
  _PipelineRegressor_default_instance_.Shutdown();
  _FeatureDescription_default_instance_.Shutdown();
  _Metadata_default_instance_.Shutdown();
  _ModelDescription_default_instance_.Shutdown();
  _SerializedModel_default_instance_.Shutdown();
  _Model_default_instance_.Shutdown();
}